

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  ColourImpl *pCVar1;
  pointer pSVar2;
  pointer pcVar3;
  ostream *poVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char *pcVar6;
  SectionStats *this_00;
  bool bVar7;
  char local_49;
  double local_48;
  string local_40;
  
  this_00 = _sectionStats;
  TablePrinter::close((this->m_tablePrinter).m_ptr,(int)_sectionStats);
  if (_sectionStats->missingAssertions == true) {
    TablePrinter::close((this->m_tablePrinter).m_ptr,(int)this_00);
    lazyPrintWithoutClosingBenchmarkTable(this);
    pCVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    (*pCVar1->_vptr_ColourImpl[2])(pCVar1,0x12);
    bVar7 = (ulong)(((long)(this->super_StreamingReporterBase).m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_StreamingReporterBase).m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) <
            2;
    pcVar6 = "\nNo assertions in test case";
    if (!bVar7) {
      pcVar6 = "\nNo assertions in section";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,pcVar6,
               (ulong)bVar7 * 2 + 0x19);
    poVar4 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," \'",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(_sectionStats->sectionInfo).name._M_dataplus._M_p,
                        (_sectionStats->sectionInfo).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n\n",3);
    std::ostream::flush();
    this_00 = (SectionStats *)0x0;
    (*pCVar1->_vptr_ColourImpl[2])(pCVar1);
  }
  local_48 = _sectionStats->durationInSeconds;
  bVar7 = shouldShowDuration((this->super_StreamingReporterBase).super_ReporterBase.
                             super_IEventListener.m_config,local_48);
  if (bVar7) {
    poVar4 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    getFormattedDuration_abi_cxx11_(&local_40,(Catch *)this_00,local_48);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," s: ",4);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(_sectionStats->sectionInfo).name._M_dataplus._M_p,
                        (_sectionStats->sectionInfo).name._M_string_length);
    local_49 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_49,1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_headerPrinted == true) {
    this->m_headerPrinted = false;
  }
  pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->super_StreamingReporterBase).m_sectionStack.
  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = pSVar2 + -1;
  pcVar3 = pSVar2[-1].name._M_dataplus._M_p;
  paVar5 = &pSVar2[-1].name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar5) {
    operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ConsoleReporter::sectionEnded(SectionStats const& _sectionStats) {
    m_tablePrinter->close();
    if (_sectionStats.missingAssertions) {
        lazyPrint();
        auto guard =
            m_colour->guardColour( Colour::ResultError ).engage( m_stream );
        if (m_sectionStack.size() > 1)
            m_stream << "\nNo assertions in section";
        else
            m_stream << "\nNo assertions in test case";
        m_stream << " '" << _sectionStats.sectionInfo.name << "'\n\n" << std::flush;
    }
    double dur = _sectionStats.durationInSeconds;
    if (shouldShowDuration(*m_config, dur)) {
        m_stream << getFormattedDuration(dur) << " s: " << _sectionStats.sectionInfo.name << '\n' << std::flush;
    }
    if (m_headerPrinted) {
        m_headerPrinted = false;
    }
    StreamingReporterBase::sectionEnded(_sectionStats);
}